

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool isSubDirectory(char *a,char *b)

{
  bool bVar1;
  bool bVar2;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,a,&local_99);
  std::__cxx11::string::string((string *)&local_58,b,&local_9a);
  bVar1 = cmsys::SystemTools::ComparePath(&local_38,&local_58);
  bVar2 = true;
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_78,a,&local_9b);
    std::__cxx11::string::string((string *)&local_98,b,&local_9c);
    bVar2 = cmsys::SystemTools::IsSubDirectory(&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

static bool isSubDirectory(const char* a, const char* b)
{
  return (cmSystemTools::ComparePath(a, b) ||
          cmSystemTools::IsSubDirectory(a, b));
}